

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::get_texel_offsets
               (Impl *impl,CallInst *instruction,uint32_t *image_flags,uint base_operand,
               uint num_coords,Id *offsets,bool instruction_is_gather)

{
  bool bVar1;
  undefined1 uVar2;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  Constant *pCVar6;
  APInt *pAVar7;
  int64_t iVar8;
  Operation *op;
  uint uVar9;
  int i;
  ulong uVar10;
  bool bVar11;
  Builder *pBVar5;
  
  this = Converter::Impl::builder(impl);
  uVar9 = 0;
  bVar11 = false;
  pBVar5 = this;
  while( true ) {
    uVar2 = SUB81(pBVar5,0);
    if (num_coords == uVar9) break;
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar9 + base_operand);
    bVar1 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar4);
    if (!bVar1) {
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar9 + base_operand)
      ;
      pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar4)->super_Constant;
      if (pCVar6 == (Constant *)0x0) {
        bVar11 = uVar9 < num_coords;
        spv::Builder::addCapability(this,CapabilityImageGatherExtended);
        uVar9 = 0x10;
        goto LAB_0015f64c;
      }
      pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
      iVar8 = LLVMBC::APInt::getSExtValue(pAVar7);
      bVar1 = iVar8 != 0;
      bVar11 = (bool)(bVar11 | bVar1);
    }
    pBVar5 = (Builder *)(ulong)bVar1;
    uVar9 = uVar9 + 1;
  }
  if (bVar11) {
    uVar9 = 8;
    bVar11 = false;
LAB_0015f64c:
    *image_flags = *image_flags | uVar9;
    IVar3 = base_operand;
    for (uVar10 = 0; uVar2 = (undefined1)IVar3, num_coords != uVar10; uVar10 = uVar10 + 1) {
      uVar9 = base_operand + (int)uVar10;
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar9);
      bVar1 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar4);
      if (bVar1) {
        i = 0;
LAB_0015f724:
        IVar3 = spv::Builder::makeIntConstant(this,i,false);
      }
      else {
        pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar9);
        if (!bVar11) {
          pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar4)->super_Constant;
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          iVar8 = LLVMBC::APInt::getSExtValue(pAVar7);
          i = (int)iVar8;
          goto LAB_0015f724;
        }
        IVar3 = spv::Builder::makeIntegerType(this,0x20,true);
        op = Converter::Impl::allocate(impl,OpBitcast,IVar3);
        Converter::Impl::add(impl,op,false);
        IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
        Operation::add_id(op,IVar3);
        IVar3 = op->id;
      }
      offsets[uVar10] = IVar3;
    }
  }
  return (bool)uVar2;
}

Assistant:

static bool get_texel_offsets(Converter::Impl &impl, const llvm::CallInst *instruction, uint32_t &image_flags,
                              unsigned base_operand, unsigned num_coords, spv::Id *offsets,
                              bool instruction_is_gather)
{
	auto &builder = impl.builder();

	bool is_const_offset = true;
	bool has_non_zero_offset = false;

	for (unsigned i = 0; i < num_coords; i++)
	{
		// Treat undefined offset as 0, since we can.
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(instruction->getOperand(base_operand + i));
			if (constant_arg)
			{
				if (constant_arg->getUniqueInteger().getSExtValue() != 0)
					has_non_zero_offset = true;
			}
			else
			{
				builder.addCapability(spv::CapabilityImageGatherExtended);
				is_const_offset = false;
				has_non_zero_offset = true;
				break;
			}
		}
	}

	// Don't bother emitting offset if they are all 0.
	if (!has_non_zero_offset)
		return true;

	if (is_const_offset)
		image_flags |= spv::ImageOperandsConstOffsetMask;
	else
		image_flags |= spv::ImageOperandsOffsetMask;

	for (unsigned i = 0; i < num_coords; i++)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto operand = instruction->getOperand(base_operand + i);
			if (is_const_offset)
			{
				auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(operand);
				offsets[i] = builder.makeIntConstant(int(constant_arg->getUniqueInteger().getSExtValue()));
			}
			else
			{
				// Makes sure when we build the array, it's the correct element type.
				auto *cast_op = impl.allocate(spv::OpBitcast, builder.makeIntegerType(32, true));
				impl.add(cast_op);
				cast_op->add_id(impl.get_id_for_value(operand));
				offsets[i] = cast_op->id;
			}
		}
		else
			offsets[i] = builder.makeIntConstant(0);
	}

	return true;
}